

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxwritestate.hpp
# Opt level: O0

bool __thiscall
soplex::SPxSolverBase<double>::writeState
          (SPxSolverBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames,
          bool cpxFormat,bool writeZeroObjective)

{
  char *pcVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  Representation RVar4;
  int iVar5;
  uint32_t uVar6;
  ostream *poVar7;
  void *pvVar8;
  SPxBasisBase<double> *this_00;
  SPxPricer<double> *pSVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SPxRatioTester<double> *pSVar10;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  element_type *peVar11;
  double *pdVar12;
  undefined8 uVar13;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  SPxSolverBase<double> *in_RDI;
  byte in_R8B;
  byte in_R9B;
  Real RVar14;
  double dVar15;
  ofstream ofs;
  string ofname;
  char *in_stack_fffffffffffffa50;
  undefined7 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5f;
  char *local_3e0;
  allocator local_331;
  string local_330 [32];
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [32];
  string local_2c8 [32];
  undefined4 local_2a8;
  allocator local_2a1;
  string local_2a0 [32];
  string local_280 [48];
  long local_250 [64];
  string local_50 [38];
  byte local_2a;
  byte local_29;
  undefined8 local_28;
  undefined8 local_20;
  char *local_18;
  byte local_1;
  
  local_29 = in_R8B & 1;
  local_2a = in_R9B & 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__cxx11::string::string(local_50);
  std::ofstream::ofstream(local_250);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,pcVar1,&local_2a1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
                 in_stack_fffffffffffffa50);
  std::__cxx11::string::operator=(local_50,local_280);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  _Var3 = std::__cxx11::string::c_str();
  std::ofstream::open((char *)local_250,_Var3);
  bVar2 = std::ios::operator!((void *)((long)local_250 + *(long *)(local_250[0] + -0x18)));
  if ((bVar2 & 1) == 0) {
    poVar7 = std::operator<<((ostream *)local_250,"# SoPlex version ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,8);
    poVar7 = std::operator<<(poVar7,".");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
    poVar7 = std::operator<<(poVar7,".");
    pvVar8 = (void *)std::ostream::operator<<(poVar7,0);
    pvVar8 = (void *)std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)local_250,"# run SoPlex as follows:");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)local_250,
                             "# bin/soplex --loadset=spxcheck.set --readbas=spxcheck.bas spxcheck.mps\n"
                            );
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)local_250,"int:representation = ");
    RVar4 = rep(in_RDI);
    if (RVar4 == COLUMN) {
      local_3e0 = 
      "5.820766091346740722656250000000000000000000000000000000000000000000000000000000000000000000000000000e-11"
      ;
    }
    else {
      local_3e0 = 
      "7.275957614183425903320312500000000000000000000000000000000000000000000000000000000000000000000000000e-12"
      ;
    }
    local_3e0 = local_3e0 + 0x68;
    poVar7 = std::operator<<(poVar7,local_3e0);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)local_250,"int:factor_update_max = ");
    this_00 = basis(in_RDI);
    iVar5 = SPxBasisBase<double>::getMaxUpdates(this_00);
    pvVar8 = (void *)std::ostream::operator<<(poVar7,iVar5);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)local_250,"int:pricer = ");
    pSVar9 = pricer(in_RDI);
    iVar5 = (**pSVar9->_vptr_SPxPricer)();
    iVar5 = strcmp((char *)CONCAT44(extraout_var,iVar5),"Auto");
    if (iVar5 == 0) {
      poVar7 = std::operator<<((ostream *)local_250," 0");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      pSVar9 = pricer(in_RDI);
      iVar5 = (**pSVar9->_vptr_SPxPricer)();
      iVar5 = strcmp((char *)CONCAT44(extraout_var_00,iVar5),"Dantzig");
      if (iVar5 == 0) {
        poVar7 = std::operator<<((ostream *)local_250,"1");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      else {
        pSVar9 = pricer(in_RDI);
        iVar5 = (**pSVar9->_vptr_SPxPricer)();
        iVar5 = strcmp((char *)CONCAT44(extraout_var_01,iVar5),"ParMult");
        if (iVar5 == 0) {
          poVar7 = std::operator<<((ostream *)local_250,"2");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        else {
          pSVar9 = pricer(in_RDI);
          iVar5 = (**pSVar9->_vptr_SPxPricer)();
          iVar5 = strcmp((char *)CONCAT44(extraout_var_02,iVar5),"Devex");
          if (iVar5 == 0) {
            poVar7 = std::operator<<((ostream *)local_250,"3");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          else {
            pSVar9 = pricer(in_RDI);
            iVar5 = (**pSVar9->_vptr_SPxPricer)();
            iVar5 = strcmp((char *)CONCAT44(extraout_var_03,iVar5),"Steep");
            if (iVar5 == 0) {
              poVar7 = std::operator<<((ostream *)local_250,"4");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            }
            else {
              pSVar9 = pricer(in_RDI);
              iVar5 = (**pSVar9->_vptr_SPxPricer)();
              iVar5 = strcmp((char *)CONCAT44(extraout_var_04,iVar5),"SteepEx");
              if (iVar5 == 0) {
                poVar7 = std::operator<<((ostream *)local_250,"5");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
            }
          }
        }
      }
    }
    std::operator<<((ostream *)local_250,"int:ratiotester = ");
    pSVar10 = ratiotester(in_RDI);
    iVar5 = (**pSVar10->_vptr_SPxRatioTester)();
    iVar5 = strcmp((char *)CONCAT44(extraout_var_05,iVar5),"Default");
    if (iVar5 == 0) {
      poVar7 = std::operator<<((ostream *)local_250,"0");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      pSVar10 = ratiotester(in_RDI);
      iVar5 = (**pSVar10->_vptr_SPxRatioTester)();
      iVar5 = strcmp((char *)CONCAT44(extraout_var_06,iVar5),"Harris");
      if (iVar5 == 0) {
        poVar7 = std::operator<<((ostream *)local_250,"1");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      else {
        pSVar10 = ratiotester(in_RDI);
        iVar5 = (**pSVar10->_vptr_SPxRatioTester)();
        iVar5 = strcmp((char *)CONCAT44(extraout_var_07,iVar5),"Fast");
        if (iVar5 == 0) {
          poVar7 = std::operator<<((ostream *)local_250,"2");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        else {
          pSVar10 = ratiotester(in_RDI);
          iVar5 = (**pSVar10->_vptr_SPxRatioTester)();
          iVar5 = strcmp((char *)CONCAT44(extraout_var_08,iVar5),"Bound Flipping");
          if (iVar5 == 0) {
            poVar7 = std::operator<<((ostream *)local_250,"3");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
        }
      }
    }
    poVar7 = std::operator<<((ostream *)local_250,"real:feastol = ");
    tolerances(in_RDI);
    peVar11 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x20e2cc);
    RVar14 = Tolerances::floatingPointFeastol(peVar11);
    pvVar8 = (void *)std::ostream::operator<<(poVar7,RVar14);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)local_250,"real:opttol = ");
    tolerances(in_RDI);
    peVar11 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x20e348);
    RVar14 = Tolerances::floatingPointOpttol(peVar11);
    pvVar8 = (void *)std::ostream::operator<<(poVar7,RVar14);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)local_250,"real:epsilon_zero = ");
    dVar15 = epsilon((SPxSolverBase<double> *)0x20e3bc);
    pvVar8 = (void *)std::ostream::operator<<(poVar7,dVar15);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)local_250,"real:infty = ");
    pdVar12 = (double *)infinity();
    pvVar8 = (void *)std::ostream::operator<<(poVar7,*pdVar12);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)local_250,"uint:random_seed = ");
    uVar6 = Random::getSeed(&in_RDI->random);
    pvVar8 = (void *)std::ostream::operator<<(poVar7,uVar6);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    std::ofstream::close();
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e8,pcVar1,&local_2e9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
                   in_stack_fffffffffffffa50);
    std::__cxx11::string::operator=(local_50,local_2c8);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    _Var3 = std::__cxx11::string::c_str();
    std::ofstream::open((char *)local_250,_Var3);
    bVar2 = std::ios::operator!((void *)((long)local_250 + *(long *)(local_250[0] + -0x18)));
    if ((bVar2 & 1) == 0) {
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x21])
                (in_RDI,local_250,local_20,local_28,0,(ulong)(local_2a & 1));
      std::ofstream::close();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_330,local_18,&local_331);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
                     in_stack_fffffffffffffa50);
      std::__cxx11::string::operator=(local_50,local_310);
      std::__cxx11::string::~string(local_310);
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
      uVar13 = std::__cxx11::string::c_str();
      iVar5 = (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>
                .super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5b])
                        (in_RDI,uVar13,local_20,local_28,(ulong)(local_29 & 1));
      local_1 = (byte)iVar5 & 1;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
  local_2a8 = 1;
  std::ofstream::~ofstream(local_250);
  std::__cxx11::string::~string(local_50);
  return (bool)(local_1 & 1);
}

Assistant:

bool SPxSolverBase<R>::writeState(
   const char*    filename,
   const NameSet* rowNames,
   const NameSet* colNames,
   const bool     cpxFormat,
   const bool     writeZeroObjective
) const
{

   std::string ofname;
   std::ofstream ofs;

   // write parameter settings
   ofname = std::string(filename) + ".set";
   ofs.open(ofname.c_str());

   if(!ofs)
      return false;

   ofs << "# SoPlex version " << SOPLEX_VERSION / 100
       << "." << (SOPLEX_VERSION / 10) % 10
       << "." << SOPLEX_VERSION % 10 << std::endl << std::endl;
   ofs << "# run SoPlex as follows:" << std::endl;
   ofs << "# bin/soplex --loadset=spxcheck.set --readbas=spxcheck.bas spxcheck.mps\n" << std::endl;
   ofs << "int:representation = " << (rep() == SPxSolverBase<R>::COLUMN ? "1" : "2") << std::endl;
   ofs << "int:factor_update_max = " << basis().getMaxUpdates() << std::endl;
   ofs << "int:pricer = ";

   if(!strcmp(pricer()->getName(), "Auto"))
      ofs << " 0" << std::endl;
   else if(!strcmp(pricer()->getName(), "Dantzig"))
      ofs << "1" << std::endl;
   else if(!strcmp(pricer()->getName(), "ParMult"))
      ofs << "2" << std::endl;
   else if(!strcmp(pricer()->getName(), "Devex"))
      ofs << "3" << std::endl;
   else if(!strcmp(pricer()->getName(), "Steep"))
      ofs << "4" << std::endl;
   else if(!strcmp(pricer()->getName(), "SteepEx"))
      ofs << "5" << std::endl;

   ofs << "int:ratiotester = ";

   if(!strcmp(ratiotester()->getName(), "Default"))
      ofs << "0" << std::endl;
   else if(!strcmp(ratiotester()->getName(), "Harris"))
      ofs << "1" << std::endl;
   else if(!strcmp(ratiotester()->getName(), "Fast"))
      ofs << "2" << std::endl;
   else if(!strcmp(ratiotester()->getName(), "Bound Flipping"))
      ofs << "3" << std::endl;

   ofs << "real:feastol = " << tolerances()->floatingPointFeastol() << std::endl;
   ofs << "real:opttol = " << tolerances()->floatingPointOpttol() << std::endl;
   ofs << "real:epsilon_zero = " << epsilon() << std::endl;
   ofs << "real:infty = " << infinity << std::endl;
   ofs << "uint:random_seed = " << random.getSeed() << std::endl;
   ofs.close();

   // write LP
   ofname = std::string(filename) + ".mps";
   ofs.open(ofname.c_str());

   if(!ofs)
      return false;

   this->writeMPS(ofs, rowNames, colNames, nullptr, writeZeroObjective);
   ofs.close();

   // write basis
   ofname = std::string(filename) + ".bas";
   return writeBasisFile(ofname.c_str(), rowNames, colNames, cpxFormat);
}